

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

bool __thiscall QPlainTextEdit::event(QPlainTextEdit *this,QEvent *e)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  Reason RVar4;
  GestureState GVar5;
  int iVar6;
  QPlainTextEditPrivate *pQVar7;
  QGesture *pQVar8;
  qreal *pqVar9;
  QEvent *in_RSI;
  QPlainTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractSlider *this_00;
  int newY;
  int newX;
  int lineHeight;
  QScrollBar *vBar;
  QScrollBar *hBar;
  QPanGesture *panGesture;
  QGesture *g;
  bool result;
  QPlainTextEditPrivate *d;
  QFontMetrics fm;
  QPointF offset;
  QPoint cursorPos;
  QContextMenuEvent ce;
  undefined4 in_stack_fffffffffffffec8;
  KeyboardModifier in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  GestureType in_stack_fffffffffffffed4;
  QGestureEvent *in_stack_fffffffffffffed8;
  QWidget *in_stack_fffffffffffffee0;
  QPlainTextEdit *in_stack_fffffffffffffee8;
  QRect *in_stack_fffffffffffffef0;
  bool local_a9;
  QPointF local_a8;
  undefined1 *local_98;
  QPointF local_90;
  uint local_7c;
  QPoint local_78;
  QRect local_70;
  QPoint local_60;
  QFont local_58 [8];
  QEvent *in_stack_ffffffffffffffb0;
  QAbstractScrollArea *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QPlainTextEdit *)0x6c465b);
  TVar3 = QEvent::type(in_RSI);
  if (TVar3 - WindowActivate < 2) {
    QWidget::palette((QWidget *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    QWidgetTextControl::setPalette
              ((QWidgetTextControl *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (QPalette *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  else if (TVar3 == ShortcutOverride) {
LAB_006c480f:
    QPlainTextEditPrivate::sendControlEvent(in_RDI,(QEvent *)in_stack_fffffffffffffef0);
  }
  else if (TVar3 == ContextMenu) {
    RVar4 = QContextMenuEvent::reason((QContextMenuEvent *)in_RSI);
    if (RVar4 == Keyboard) {
      ensureCursorVisible((QPlainTextEdit *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      local_60 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_70 = cursorRect(in_stack_fffffffffffffee8);
      local_60 = QRect::center(in_stack_fffffffffffffef0);
      memset(&stack0xffffffffffffffb8,0xaa,0x40);
      local_78 = QWidget::mapToGlobal(in_stack_fffffffffffffee0,(QPoint *)in_stack_fffffffffffffed8)
      ;
      QFlags<Qt::KeyboardModifier>::QFlags
                ((QFlags<Qt::KeyboardModifier> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc);
      QContextMenuEvent::QContextMenuEvent
                ((QContextMenuEvent *)&stack0xffffffffffffffb8,Keyboard,(QPoint *)&local_60,
                 (QPoint *)&local_78,(QFlags_conflict1 *)(ulong)local_7c);
      bVar2 = QEvent::isAccepted(in_RSI);
      QEvent::setAccepted((QEvent *)&stack0xffffffffffffffb8,bVar2);
      local_a9 = QAbstractScrollArea::event(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      bVar2 = QEvent::isAccepted((QEvent *)&stack0xffffffffffffffb8);
      (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar2);
      QContextMenuEvent::~QContextMenuEvent((QContextMenuEvent *)&stack0xffffffffffffffb8);
      goto LAB_006c4a6e;
    }
  }
  else {
    if (TVar3 == ToolTip) goto LAB_006c480f;
    if (TVar3 == Gesture) {
      pQVar8 = QGestureEvent::gesture(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
      if (pQVar8 != (QGesture *)0x0) {
        QAbstractScrollArea::horizontalScrollBar
                  ((QAbstractScrollArea *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        QAbstractScrollArea::verticalScrollBar
                  ((QAbstractScrollArea *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        GVar5 = QGesture::state((QGesture *)0x6c4875);
        if (GVar5 == GestureStarted) {
          iVar6 = QAbstractSlider::value
                            ((QAbstractSlider *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
          pQVar7->originalOffsetY = iVar6;
        }
        local_90.yp = -NAN;
        local_90.xp = -NAN;
        local_90 = QPanGesture::offset((QPanGesture *)in_stack_fffffffffffffed8);
        bVar2 = QPointF::isNull((QPointF *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        if (!bVar2) {
          bVar2 = QGuiApplication::isRightToLeft();
          if (bVar2) {
            pqVar9 = QPointF::rx(&local_90);
            *pqVar9 = *pqVar9 * -1.0;
          }
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          document((QPlainTextEdit *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
          QTextDocument::defaultFont();
          QFontMetrics::QFontMetrics((QFontMetrics *)&local_98,local_58);
          QFont::~QFont(local_58);
          QFontMetrics::height();
          iVar6 = QAbstractSlider::value
                            ((QAbstractSlider *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
          iVar6 = (int)((ulong)(double)iVar6 >> 0x20);
          local_a8 = QPanGesture::delta((QPanGesture *)
                                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0
                                                ));
          QPointF::x(&local_a8);
          this_00 = (QAbstractSlider *)(double)pQVar7->originalOffsetY;
          QPointF::y(&local_90);
          QAbstractSlider::setValue(this_00,iVar6);
          QAbstractSlider::setValue(this_00,iVar6);
          QFontMetrics::~QFontMetrics((QFontMetrics *)&local_98);
        }
      }
      local_a9 = true;
      goto LAB_006c4a6e;
    }
  }
  local_a9 = QAbstractScrollArea::event(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
LAB_006c4a6e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_a9;
}

Assistant:

bool QPlainTextEdit::event(QEvent *e)
{
    Q_D(QPlainTextEdit);

    switch (e->type()) {
#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        if (static_cast<QContextMenuEvent *>(e)->reason() == QContextMenuEvent::Keyboard) {
            ensureCursorVisible();
            const QPoint cursorPos = cursorRect().center();
            QContextMenuEvent ce(QContextMenuEvent::Keyboard, cursorPos, d->viewport->mapToGlobal(cursorPos));
            ce.setAccepted(e->isAccepted());
            const bool result = QAbstractScrollArea::event(&ce);
            e->setAccepted(ce.isAccepted());
            return result;
        }
        break;
#endif // QT_NO_CONTEXTMENU
    case QEvent::ShortcutOverride:
    case QEvent::ToolTip:
        d->sendControlEvent(e);
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
    case QEvent::LeaveEditFocus:
        if (QApplicationPrivate::keypadNavigationEnabled())
            d->sendControlEvent(e);
        break;
#endif
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
        if (auto *g = static_cast<QGestureEvent *>(e)->gesture(Qt::PanGesture)) {
            QPanGesture *panGesture = static_cast<QPanGesture *>(g);
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            if (panGesture->state() == Qt::GestureStarted)
                d->originalOffsetY = vBar->value();
            QPointF offset = panGesture->offset();
            if (!offset.isNull()) {
                if (QGuiApplication::isRightToLeft())
                    offset.rx() *= -1;
                // QPlainTextEdit scrolls by lines only in vertical direction
                QFontMetrics fm(document()->defaultFont());
                int lineHeight = fm.height();
                int newX = hBar->value() - panGesture->delta().x();
                int newY = d->originalOffsetY - offset.y()/lineHeight;
                hBar->setValue(newX);
                vBar->setValue(newY);
            }
        }
        return true;
#endif // QT_NO_GESTURES
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        d->control->setPalette(palette());
        break;
    default:
        break;
    }
    return QAbstractScrollArea::event(e);
}